

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_truetype.h
# Opt level: O1

void stbtt_GetGlyphBitmapBoxSubpixel
               (stbtt_fontinfo *font,int glyph,float scale_x,float scale_y,float shift_x,
               float shift_y,int *ix0,int *iy0,int *ix1,int *iy1)

{
  uchar *puVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  uint unaff_EBX;
  uint uVar6;
  float fVar7;
  stbtt__csctx local_68;
  
  if ((font->cff).size == 0) {
    uVar4 = stbtt__GetGlyfOffset(font,glyph);
    if ((int)uVar4 < 0) {
      bVar2 = true;
      uVar3 = 0;
      uVar6 = 0;
      goto LAB_0016552d;
    }
    puVar1 = font->data;
    uVar3 = (int)(short)((ushort)puVar1[(ulong)uVar4 + 2] << 8) | (uint)puVar1[(ulong)uVar4 + 3];
    uVar6 = (int)(short)((ushort)puVar1[(ulong)uVar4 + 4] << 8) | (uint)puVar1[(ulong)uVar4 + 5];
    font = (stbtt_fontinfo *)
           (ulong)((int)(short)((ushort)puVar1[(ulong)uVar4 + 6] << 8) |
                  (uint)puVar1[(ulong)uVar4 + 7]);
    unaff_EBX = (int)(short)((ushort)puVar1[(ulong)uVar4 + 8] << 8) | (uint)puVar1[(ulong)uVar4 + 9]
    ;
  }
  else {
    local_68.first_x = 0.0;
    local_68.first_y = 0.0;
    local_68.min_y = 0;
    local_68.max_y = 0;
    local_68.pvertices = (stbtt_vertex *)0x0;
    local_68.x = 0.0;
    local_68.y = 0.0;
    local_68.min_x = 0;
    local_68.max_x = 0;
    local_68.num_vertices = 0;
    local_68._52_4_ = 0;
    local_68.bounds = 1;
    local_68.started = 0;
    uVar3 = stbtt__run_charstring(font,glyph,&local_68);
    font = (stbtt_fontinfo *)(ulong)uVar3;
    uVar6 = uVar3;
    unaff_EBX = uVar3;
    if (uVar3 != 0) {
      font = (stbtt_fontinfo *)((ulong)local_68._24_8_ >> 0x20);
      uVar3 = local_68.min_x;
      uVar6 = local_68.min_y;
      unaff_EBX = local_68.max_y;
    }
  }
  bVar2 = false;
LAB_0016552d:
  if (bVar2) {
    if (ix0 != (int *)0x0) {
      *ix0 = 0;
    }
    if (iy0 != (int *)0x0) {
      *iy0 = 0;
    }
    if (ix1 != (int *)0x0) {
      *ix1 = 0;
    }
    iVar5 = 0;
    if (iy1 == (int *)0x0) {
      return;
    }
  }
  else {
    if (ix0 != (int *)0x0) {
      fVar7 = floorf((float)(int)uVar3 * scale_x + 0.0);
      *ix0 = (int)fVar7;
    }
    if (iy0 != (int *)0x0) {
      fVar7 = floorf((float)(int)-unaff_EBX * scale_y + 0.0);
      *iy0 = (int)fVar7;
    }
    if (ix1 != (int *)0x0) {
      fVar7 = ceilf((float)(int)font * scale_x + 0.0);
      *ix1 = (int)fVar7;
    }
    if (iy1 == (int *)0x0) {
      return;
    }
    fVar7 = ceilf((float)(int)-uVar6 * scale_y + 0.0);
    iVar5 = (int)fVar7;
  }
  *iy1 = iVar5;
  return;
}

Assistant:

STBTT_DEF void stbtt_GetGlyphBitmapBoxSubpixel(const stbtt_fontinfo *font, int glyph, float scale_x, float scale_y,float shift_x, float shift_y, int *ix0, int *iy0, int *ix1, int *iy1)
{
   int x0=0,y0=0,x1,y1; // =0 suppresses compiler warning
   if (!stbtt_GetGlyphBox(font, glyph, &x0,&y0,&x1,&y1)) {
      // e.g. space character
      if (ix0) *ix0 = 0;
      if (iy0) *iy0 = 0;
      if (ix1) *ix1 = 0;
      if (iy1) *iy1 = 0;
   } else {
      // move to integral bboxes (treating pixels as little squares, what pixels get touched)?
      if (ix0) *ix0 = STBTT_ifloor( x0 * scale_x + shift_x);
      if (iy0) *iy0 = STBTT_ifloor(-y1 * scale_y + shift_y);
      if (ix1) *ix1 = STBTT_iceil ( x1 * scale_x + shift_x);
      if (iy1) *iy1 = STBTT_iceil (-y0 * scale_y + shift_y);
   }
}